

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linenoise.c
# Opt level: O0

void linenoiseEditBackspace(linenoiseState *l)

{
  linenoiseState *l_local;
  
  if ((l->pos != 0) && (l->len != 0)) {
    memmove(l->buf + (l->pos - 1),l->buf + l->pos,l->len - l->pos);
    l->pos = l->pos - 1;
    l->len = l->len - 1;
    l->buf[l->len] = '\0';
    linenoiseRefreshLine();
  }
  return;
}

Assistant:

void linenoiseEditBackspace(struct linenoiseState *l) {
    if (l->pos > 0 && l->len > 0) {
        memmove(l->buf+l->pos-1,l->buf+l->pos,l->len-l->pos);
        l->pos--;
        l->len--;
        l->buf[l->len] = '\0';
        linenoiseRefreshLine();
    }
}